

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_sse.c
# Opt level: O0

parasail_profile_t *
parasail_profile_create_stats_sse_128_64(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  uint local_118;
  int local_114;
  int local_110;
  int local_10c;
  longlong lStack_108;
  __m128i_64_t s;
  __m128i_64_t m;
  __m128i_64_t p;
  undefined8 local_d0;
  parasail_profile_t *profile;
  __m128i *palStack_c0;
  int32_t index;
  __m128i *vProfileS;
  __m128i *vProfileM;
  __m128i *vProfile;
  int32_t segLen;
  int32_t segWidth;
  int32_t n;
  int32_t segNum;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1Len;
  parasail_matrix_t *matrix_local;
  char *pcStack_78;
  int _s1Len_local;
  char *s1_local;
  
  j = 0;
  k = 0;
  segNum = 0;
  n = 0;
  segWidth = 0;
  segLen = 0;
  vProfile._4_4_ = 2;
  vProfile._0_4_ = 0;
  vProfileM = (__m128i *)0x0;
  vProfileS = (__m128i *)0x0;
  palStack_c0 = (__m128i *)0x0;
  profile._4_4_ = 0;
  local_d0 = 0;
  _i = matrix;
  matrix_local._4_4_ = _s1Len;
  pcStack_78 = s1;
  if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_profile_create_stats_sse_128_64","matrix");
    s1_local = (char *)0x0;
  }
  else if (s1 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_profile_create_stats_sse_128_64","s1");
    s1_local = (char *)0x0;
  }
  else {
    local_10c = _s1Len;
    if (matrix->type != 0) {
      local_10c = matrix->length;
    }
    j = local_10c;
    segLen = matrix->size;
    vProfile._0_4_ = (local_10c + 1) / 2;
    vProfileM = parasail_memalign___m128i(0x10,(long)(segLen * (int)vProfile));
    if (vProfileM == (__m128i *)0x0) {
      s1_local = (char *)0x0;
    }
    else {
      vProfileS = parasail_memalign___m128i(0x10,(long)(segLen * (int)vProfile));
      if (vProfileS == (__m128i *)0x0) {
        s1_local = (char *)0x0;
      }
      else {
        palStack_c0 = parasail_memalign___m128i(0x10,(long)(segLen * (int)vProfile));
        if (palStack_c0 == (__m128i *)0x0) {
          s1_local = (char *)0x0;
        }
        else {
          s1_local = (char *)parasail_profile_new(pcStack_78,j,_i);
          if ((parasail_profile_t *)s1_local == (parasail_profile_t *)0x0) {
            s1_local = (char *)0x0;
          }
          else {
            for (n = 0; n < segLen; n = n + 1) {
              for (k = 0; k < (int)vProfile; k = k + 1) {
                segNum = k;
                for (segWidth = 0; segWidth < 2; segWidth = segWidth + 1) {
                  if (_i->type == 0) {
                    if (segNum < j) {
                      local_110 = _i->matrix[segLen * n + _i->mapper[(byte)pcStack_78[segNum]]];
                    }
                    else {
                      local_110 = 0;
                    }
                    *(long *)((long)&m + (long)segWidth * 8 + 8) = (long)local_110;
                  }
                  else {
                    if (segNum < j) {
                      local_114 = _i->matrix[segLen * segNum + _i->mapper[(byte)_i->alphabet[n]]];
                    }
                    else {
                      local_114 = 0;
                    }
                    *(long *)((long)&m + (long)segWidth * 8 + 8) = (long)local_114;
                  }
                  if (segNum < j) {
                    local_118 = (uint)(n == _i->mapper[(byte)pcStack_78[segNum]]);
                  }
                  else {
                    local_118 = 0;
                  }
                  *(long *)((long)&s + (long)segWidth * 8 + 8) = (long)(int)local_118;
                  (&lStack_108)[segWidth] =
                       (long)(int)(uint)(0 < *(long *)((long)&m + (long)segWidth * 8 + 8));
                  segNum = (int)vProfile + segNum;
                }
                vProfileM[profile._4_4_][0] = m.m[1];
                vProfileM[profile._4_4_][1] = p.m[0];
                vProfileS[profile._4_4_][0] = s.m[1];
                vProfileS[profile._4_4_][1] = m.m[0];
                palStack_c0[profile._4_4_][0] = lStack_108;
                palStack_c0[profile._4_4_][1] = s.m[0];
                profile._4_4_ = profile._4_4_ + 1;
              }
            }
            (((parasail_profile_t *)s1_local)->profile64).score = vProfileM;
            (((parasail_profile_t *)s1_local)->profile64).matches = vProfileS;
            (((parasail_profile_t *)s1_local)->profile64).similar = palStack_c0;
            ((parasail_profile_t *)s1_local)->free = parasail_free___m128i;
          }
        }
      }
    }
  }
  return (parasail_profile_t *)s1_local;
}

Assistant:

parasail_profile_t * parasail_profile_create_stats_sse_128_64(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0;
    const int32_t segWidth = 2; /* number of values in vector unit */
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is required for both pssm and square */
    PARASAIL_CHECK_NULL(s1);

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size; /* number of amino acids in table */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m128i(16, n * segLen);
    if (!vProfile) return NULL;
    vProfileM = parasail_memalign___m128i(16, n * segLen);
    if (!vProfileM) return NULL;
    vProfileS = parasail_memalign___m128i(16, n * segLen);
    if (!vProfileS) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m128i_64_t p;
            __m128i_64_t m;
            __m128i_64_t s;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                m.v[segNum] = j >= s1Len ? 0 : (k == matrix->mapper[(unsigned char)s1[j]]);
                s.v[segNum] = p.v[segNum] > 0;
                j += segLen;
            }
            _mm_store_si128(&vProfile[index], p.m);
            _mm_store_si128(&vProfileM[index], m.m);
            _mm_store_si128(&vProfileS[index], s.m);
            ++index;
        }
    }

    profile->profile64.score = vProfile;
    profile->profile64.matches = vProfileM;
    profile->profile64.similar = vProfileS;
    profile->free = &parasail_free___m128i;
    return profile;
}